

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.h
# Opt level: O0

void witness_assert_not_owner(witness_tsdn_t *witness_tsdn,witness_t *witness)

{
  witness_t *w;
  witness_list_t *witnesses;
  witness_tsd_t *witness_tsd;
  witness_t *witness_local;
  witness_tsdn_t *witness_tsdn_local;
  
  return;
}

Assistant:

static inline void
witness_assert_not_owner(witness_tsdn_t *witness_tsdn,
    const witness_t *witness) {
	witness_tsd_t *witness_tsd;
	witness_list_t *witnesses;
	witness_t *w;

	if (!config_debug) {
		return;
	}

	if (witness_tsdn_null(witness_tsdn)) {
		return;
	}
	witness_tsd = witness_tsdn_tsd(witness_tsdn);
	if (witness->rank == WITNESS_RANK_OMIT) {
		return;
	}

	witnesses = &witness_tsd->witnesses;
	ql_foreach(w, witnesses, link) {
		if (w == witness) {
			witness_not_owner_error(witness);
		}
	}
}